

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O1

genxStatus genxStartElement(genxElement e)

{
  writerSequence wVar1;
  int iVar2;
  genxWriter w;
  void **ppvVar3;
  int iVar4;
  genxStatus gVar5;
  long lVar6;
  long lVar7;
  
  w = e->writer;
  wVar1 = w->sequence;
  if (wVar1 - SEQUENCE_START_TAG < 2) {
    gVar5 = writeStartTag(w);
    w->status = gVar5;
    if (gVar5 != GENX_SUCCESS) {
      return gVar5;
    }
  }
  else if ((wVar1 == SEQUENCE_POST_DOC) || (wVar1 == SEQUENCE_NO_DOC)) {
    w->status = GENX_SEQUENCE_ERROR;
    return GENX_SEQUENCE_ERROR;
  }
  w->sequence = SEQUENCE_START_TAG;
  lVar6 = (long)(w->attributes).count;
  if (0 < lVar6) {
    ppvVar3 = (w->attributes).pointers;
    lVar7 = 0;
    do {
      *(undefined4 *)((long)ppvVar3[lVar7] + 0x28) = 0;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  iVar4 = checkExpand(&w->stack);
  if (iVar4 == 0) {
    gVar5 = GENX_ALLOC_FAILED;
  }
  else {
    iVar2 = (w->stack).count;
    (w->stack).count = iVar2 + 1;
    (w->stack).pointers[iVar2] = e;
    gVar5 = GENX_SUCCESS;
  }
  w->status = gVar5;
  if (iVar4 != 0) {
    iVar4 = checkExpand(&w->stack);
    if (iVar4 == 0) {
      gVar5 = GENX_ALLOC_FAILED;
    }
    else {
      iVar2 = (w->stack).count;
      (w->stack).count = iVar2 + 1;
      (w->stack).pointers[iVar2] = (void *)0x0;
      gVar5 = GENX_SUCCESS;
    }
    w->status = gVar5;
    if (iVar4 != 0) {
      w->nowStarting = e;
      gVar5 = GENX_SUCCESS;
    }
  }
  return gVar5;
}

Assistant:

genxStatus genxStartElement(genxElement e)
{
  genxWriter w = e->writer;
  int i;

  switch (w->sequence)
  {
  case SEQUENCE_NO_DOC:
  case SEQUENCE_POST_DOC:
    return w->status = GENX_SEQUENCE_ERROR;
  case SEQUENCE_START_TAG:
  case SEQUENCE_ATTRIBUTES:
    if ((w->status = writeStartTag(w)) != GENX_SUCCESS)
      return w->status;
    break;
  case SEQUENCE_PRE_DOC:
  case SEQUENCE_CONTENT:
    break;
  }

  w->sequence = SEQUENCE_START_TAG;

  /* clear provided attributes */
  for (i = 0; i < w->attributes.count; i++)
    ((genxAttribute) w->attributes.pointers[i])->provided = 0;

  /*
   * push the stack.  We push a NULL after a pointer to this element
   *  because the stack will also contain pointers to the namespace
   *  attributes that got declared here, so we can keep track of what's
   *  in effect.  I.e. a single stack entry consists logically of a pointer
   *  to an element object, a NULL, then zero or more pairs of pointers to
   *  namespace objects/declarations
   */
  if ((w->status = listAppend(&w->stack, e)) != GENX_SUCCESS)
    return w->status;
  if ((w->status = listAppend(&w->stack, NULL)) != GENX_SUCCESS)
    return w->status;

  w->nowStarting = e;

  return GENX_SUCCESS;
}